

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_delete(REF_AGENTS ref_agents,REF_INT node)

{
  uint uVar1;
  int local_20;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT id;
  REF_INT node_local;
  REF_AGENTS ref_agents_local;
  
  if (node < 0) {
    ref_agents_local._4_4_ = 3;
  }
  else {
    for (local_20 = 0; local_20 < ref_agents->max; local_20 = local_20 + 1) {
      if (((ref_agents->agent[local_20].mode != REF_AGENT_UNUSED) &&
          (node == ref_agents->agent[local_20].node)) &&
         (uVar1 = ref_agents_remove(ref_agents,local_20), uVar1 != 0)) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               0xe8,"ref_agents_delete",(ulong)uVar1,"rm");
        return uVar1;
      }
    }
    ref_agents_local._4_4_ = 0;
  }
  return ref_agents_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_agents_delete(REF_AGENTS ref_agents, REF_INT node) {
  REF_INT id;

  if (node < 0) return REF_INVALID;

  each_active_ref_agent(ref_agents, id) {
    if (node == ref_agent_node(ref_agents, id))
      RSS(ref_agents_remove(ref_agents, id), "rm");
  }

  return REF_SUCCESS;
}